

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1c02d::CpuTest_jmp_indirect_fetches_address_from_same_page_Test::TestBody
          (CpuTest_jmp_indirect_fetches_address_from_same_page_Test *this)

{
  NiceMock<n_e_s::core::test::MockMmu> *this_00;
  CpuRegisters *rhs;
  undefined2 uVar1;
  undefined2 uVar2;
  int iVar3;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar4;
  int *piVar5;
  ActionInterface<unsigned_char_(unsigned_short)> *pAVar6;
  char cVar7;
  _func_int *message;
  AssertionResult gtest_ar;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  _Any_data local_88;
  code *local_78;
  undefined1 local_68 [8];
  MatcherBase<unsigned_short> local_60;
  MatcherBase<unsigned_short> local_48;
  
  (this->super_CpuTest).registers.pc = 0x1000;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,'l');
  (this->super_CpuTest).expected.pc = 0x6789;
  this_00 = &(this->super_CpuTest).mmu;
  uVar1 = (this->super_CpuTest).registers.pc;
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_48,uVar1 + 1);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_48);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x152,"mmu","read_byte(registers.pc + 1u)");
  piVar5 = (int *)operator_new(4);
  *piVar5 = 0xff;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_90,piVar5);
  pAVar6 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar6->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar3 = *piVar5;
  *(int *)&pAVar6[1]._vptr_ActionInterface = iVar3;
  *(char *)((long)&pAVar6[1]._vptr_ActionInterface + 4) = (char)iVar3;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_88,pAVar6);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar4,(Action<unsigned_char_(unsigned_short)> *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  rhs = &(this->super_CpuTest).registers;
  if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_68)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_48);
  uVar2 = rhs->pc;
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_48,uVar2 + 2);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_48);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x153,"mmu","read_byte(registers.pc + 2u)");
  piVar5 = (int *)operator_new(4);
  *piVar5 = 0x12;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_90,piVar5);
  pAVar6 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar6->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar3 = *piVar5;
  *(int *)&pAVar6[1]._vptr_ActionInterface = iVar3;
  *(char *)((long)&pAVar6[1]._vptr_ActionInterface + 4) = (char)iVar3;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_88,pAVar6);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar4,(Action<unsigned_char_(unsigned_short)> *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_68)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_48);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_48,0x12ff);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_48);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x155,"mmu","read_byte(0x12FF)");
  piVar5 = (int *)operator_new(4);
  *piVar5 = 0x89;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_90,piVar5);
  pAVar6 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar6->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar3 = *piVar5;
  *(int *)&pAVar6[1]._vptr_ActionInterface = iVar3;
  *(char *)((long)&pAVar6[1]._vptr_ActionInterface + 4) = (char)iVar3;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_88,pAVar6);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar4,(Action<unsigned_char_(unsigned_short)> *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_68)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_48);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_48,0x1200);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_48);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x156,"mmu","read_byte(0x1200)");
  piVar5 = (int *)operator_new(4);
  *piVar5 = 0x67;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_90,piVar5);
  pAVar6 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar6->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar3 = *piVar5;
  *(int *)&pAVar6[1]._vptr_ActionInterface = iVar3;
  *(char *)((long)&pAVar6[1]._vptr_ActionInterface + 4) = (char)iVar3;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_88,pAVar6);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar4,(Action<unsigned_char_(unsigned_short)> *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_68)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_48);
  cVar7 = '\x05';
  do {
    (*(((this->super_CpuTest).cpu._M_t.
        super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>.
        _M_t.
        super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>
        .super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl)->super_ICpu)._vptr_ICpu
      [2])();
    cVar7 = cVar7 + -1;
  } while (cVar7 != '\0');
  testing::internal::CmpHelperEQ<n_e_s::core::CpuRegisters,n_e_s::core::CpuRegisters>
            ((internal *)local_68,"expected","registers",&(this->super_CpuTest).expected,rhs);
  if (local_68[0] == '\0') {
    testing::Message::Message((Message *)&local_88);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int *)0x247c3a;
    }
    else {
      message = *local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x15a,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((long *)local_88._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_88._M_unused._M_object + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<unsigned_char_(unsigned_short)> *)local_68)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  return;
}

Assistant:

TEST_F(CpuTest, jmp_indirect_fetches_address_from_same_page) {
    registers.pc = 0x1000;
    stage_instruction(JMP_IND);
    expected.pc = 0x6789;

    EXPECT_CALL(mmu, read_byte(registers.pc + 1u)).WillOnce(Return(0xFF));
    EXPECT_CALL(mmu, read_byte(registers.pc + 2u)).WillOnce(Return(0x12));
    // Address is fetched from 0x12FF and 0x1200 instead of 0x12FF and 0x1300
    EXPECT_CALL(mmu, read_byte(0x12FF)).WillOnce(Return(0x89));
    EXPECT_CALL(mmu, read_byte(0x1200)).WillOnce(Return(0x67));

    step_execution(5);

    EXPECT_EQ(expected, registers);
}